

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::saveOriginalGraph(Graph *this)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  difference_type dVar5;
  size_type sVar6;
  reference pvVar7;
  reference piVar8;
  ostream *poVar9;
  int *j_1;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  undefined1 auStack_288 [4];
  int i_1;
  fstream file;
  ostream local_278 [516];
  int local_74;
  iterator iStack_70;
  int nv;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  int local_5c;
  int local_58;
  int j;
  int local_44;
  int *local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  int local_30;
  undefined4 local_2c;
  int i;
  vector<int,_std::allocator<int>_> counter;
  Graph *this_local;
  
  counter.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &this->num_of_vert;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i);
  if ((this->adjoint_status & 1U) == 0) {
    local_2c = 1;
  }
  else {
    for (local_30 = 0; local_30 < 0x32; local_30 = local_30 + 1) {
      bVar2 = std::vector<int,_std::allocator<int>_>::empty(this->original_list + local_30);
      if (!bVar2) {
        local_38._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)&i);
        local_40 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)&i);
        local_44 = local_30 + 1;
        dVar5 = std::
                count<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                          (local_38,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     )local_40,&local_44);
        if (dVar5 == 0) {
          local_58 = local_30 + 1;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&i,&local_58);
        }
        for (local_5c = 0; iVar1 = local_5c,
            sVar6 = std::vector<int,_std::allocator<int>_>::size(this->original_list + local_30),
            iVar1 < (int)sVar6; local_5c = local_5c + 1) {
          local_68._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)&i);
          iStack_70 = std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)&i);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (this->original_list + local_30,(long)local_5c);
          dVar5 = std::
                  count<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                            (local_68,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       )iStack_70._M_current,pvVar7);
          if (dVar5 == 0) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (this->original_list + local_30,(long)local_5c);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&i,pvVar7);
          }
        }
      }
    }
    sVar6 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&i);
    local_74 = (int)sVar6;
    _Var4 = std::operator|(_S_out,_S_trunc);
    std::fstream::fstream(auStack_288,"graph_original.txt",_Var4);
    bVar3 = std::ios::good();
    if ((bVar3 & 1) == 0) {
      poVar9 = std::operator<<((ostream *)&std::cout,"Error while opening the file");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar9 = (ostream *)std::ostream::operator<<(local_278,local_74);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      for (__range3._4_4_ = 0; __range3._4_4_ < local_74; __range3._4_4_ = __range3._4_4_ + 1) {
        bVar2 = std::vector<int,_std::allocator<int>_>::empty(this->original_list + __range3._4_4_);
        if (bVar2) {
          poVar9 = std::operator<<(local_278,'/');
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        else {
          __end3 = std::vector<int,_std::allocator<int>_>::begin
                             (this->original_list + __range3._4_4_);
          j_1 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 (this->original_list + __range3._4_4_);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                             *)&j_1), bVar2) {
            piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end3);
            poVar9 = (ostream *)std::ostream::operator<<(local_278,*piVar8);
            std::operator<<(poVar9,' ');
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end3);
          }
          poVar9 = std::operator<<(local_278,"/");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
      }
      std::fstream::close();
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar9 = std::operator<<(poVar9,"Graph Saved!");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    local_2c = 1;
    std::fstream::~fstream(auStack_288);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  return;
}

Assistant:

void Graph::saveOriginalGraph(){
   vector<int> counter;
   if(not(this->adjoint_status))
      return void();
   for(int i = 0; i < 50 ; i++){
      if(not(this->original_list[i].empty())){
         if(not(count(counter.begin(), counter.end(), (i+1))))
            counter.push_back(i+1);
         for(int j = 0; j < (int)this->original_list[i].size(); j++){
            if(not(count(counter.begin(), counter.end(), this->original_list[i][j])))
               counter.push_back(this->original_list[i][j]);
         }
      }
   }
   int nv = (int)counter.size();
   fstream file("graph_original.txt", fstream::out|fstream::trunc);
   if(file.good()){
      file << nv << endl; //read first line which is our number of vertices
      for(int i = 0; i< nv; i++){
         if(this->original_list[i].empty()){
            file<< '/'<<endl;
            continue;
         }
         for(auto &j : this->original_list[i]){
            file << j << ' ';
         }
         file << "/" << endl;
      }
      file.close();
   }else{
      cout << "Error while opening the file" << endl;
      return void();
   }
   cout << endl << "Graph Saved!" << endl;
   return void();
}